

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O3

bool private_ACUtils_ADynArray_shrinkToFit(void *dynArray,size_t typeSize)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  private_ACUtils_DynArray_Prototype *prototype;
  bool bVar5;
  long lVar6;
  
  bVar5 = false;
  if ((dynArray != (void *)0x0) && (bVar5 = false, *(code **)((long)dynArray + 0x10) != (code *)0x0)
     ) {
    uVar1 = *(ulong *)((long)dynArray + 0x20);
    uVar4 = (**(code **)((long)dynArray + 0x10))(*(undefined8 *)((long)dynArray + 0x18));
    bVar5 = true;
    if (uVar4 < uVar1) {
      uVar2 = *(undefined8 *)((long)dynArray + 0x20);
      lVar6 = 0;
      if (*(long *)((long)dynArray + 0x18) != 0) {
        lVar6 = *(long *)((long)dynArray + 0x18) + -1;
      }
      *(long *)((long)dynArray + 0x20) = lVar6;
      bVar3 = private_ACUtils_ADynArray_reserve(dynArray,lVar6 + 1,true,typeSize);
      if (bVar3 == false) {
        *(undefined8 *)((long)dynArray + 0x20) = uVar2;
        bVar5 = false;
      }
    }
  }
  return bVar5;
}

Assistant:

ACUTILS_HD_FUNC bool private_ACUtils_ADynArray_shrinkToFit(void *dynArray, size_t typeSize)
{
    if(dynArray != NULL) {
        struct private_ACUtils_DynArray_Prototype* prototype = (struct private_ACUtils_DynArray_Prototype*) dynArray;
        if(prototype->growStrategy != NULL) {
            if(prototype->capacity > prototype->growStrategy(prototype->size, typeSize)) {
                size_t capacityBackup = prototype->capacity;
                prototype->capacity = (prototype->size == 0) ? 0 : prototype->size - 1;
                if(!private_ACUtils_ADynArray_reserve(dynArray, prototype->capacity + 1, true, typeSize)) {
                    prototype->capacity = capacityBackup;
                } else {
                    return true;
                }
            } else {
                return true;
            }
        }
    }
    return false;
}